

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  int iVar1;
  ulong uVar2;
  size_t desc_00;
  size_type sVar3;
  const_reference pvVar4;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_58;
  Result local_40;
  Type local_3c;
  Enum local_34;
  ulong local_30;
  size_t i;
  char *desc_local;
  TypeVector *sig_local;
  TypeChecker *this_local;
  Result result;
  
  i = (size_t)desc;
  desc_local = (char *)sig;
  sig_local = (TypeVector *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  local_30 = 0;
  while( true ) {
    uVar2 = local_30;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local);
    desc_00 = i;
    if (sVar3 <= uVar2) break;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local);
    iVar1 = (int)local_30;
    pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local,local_30);
    local_3c.enum_ = pvVar4->enum_;
    local_3c.type_index_ = pvVar4->type_index_;
    local_34 = (Enum)PeekAndCheckType(this,((int)sVar3 - iVar1) - 1,local_3c);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
    local_30 = local_30 + 1;
  }
  local_40.enum_ = this_local._4_4_;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            (&local_58,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)desc_local);
  PrintStackIfFailed<std::vector<wabt::Type,std::allocator<wabt::Type>>>
            (this,local_40,(char *)desc_00,&local_58);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailed(result, desc, sig);
  return result;
}